

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

char * __thiscall
cmsys::SystemInformationImplementation::GetHostname(SystemInformationImplementation *this)

{
  string *psVar1;
  int iVar2;
  utsname unameInfo;
  utsname local_18e;
  
  psVar1 = &this->Hostname;
  if ((this->Hostname)._M_string_length == 0) {
    std::__cxx11::string::assign((char *)psVar1);
    iVar2 = uname(&local_18e);
    if (iVar2 == 0) {
      std::__cxx11::string::assign((char *)psVar1);
    }
  }
  return (psVar1->_M_dataplus)._M_p;
}

Assistant:

const char* SystemInformationImplementation::GetHostname()
{
  if (this->Hostname.empty())
    {
    this->Hostname="localhost";
#if defined(_WIN32)
    WORD wVersionRequested;
    WSADATA wsaData;
    char name[255];
    wVersionRequested = MAKEWORD(2,0);
    if ( WSAStartup( wVersionRequested, &wsaData ) == 0 )
      {
      gethostname(name,sizeof(name));
      WSACleanup( );
      }
    this->Hostname = name;
#else
    struct utsname unameInfo;
    int errorFlag = uname(&unameInfo);
    if(errorFlag == 0)
      {
      this->Hostname = unameInfo.nodename;
      }
#endif
    }
  return this->Hostname.c_str();
}